

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParsingUtils.h
# Opt level: O2

bool Assimp::GetNextLine<char>(char **buffer,char *out)

{
  byte bVar1;
  byte *pbVar2;
  long lVar3;
  byte bVar4;
  
  pbVar2 = (byte *)*buffer;
  bVar1 = *pbVar2;
  if (bVar1 != 0) {
    bVar4 = bVar1;
    for (lVar3 = 0; ((0xd < bVar4 || ((0x3401U >> (bVar4 & 0x1f) & 1) == 0)) && (lVar3 != 0x1000));
        lVar3 = lVar3 + 1) {
      *buffer = (char *)(pbVar2 + 1);
      out[lVar3] = *pbVar2;
      pbVar2 = (byte *)*buffer;
      bVar4 = *pbVar2;
    }
    out[lVar3] = '\0';
    pbVar2 = (byte *)*buffer;
    while( true ) {
      if ((0xd < *pbVar2) || ((0x3400U >> (*pbVar2 & 0x1f) & 1) == 0)) break;
      *buffer = (char *)(pbVar2 + 1);
      pbVar2 = pbVar2 + 1;
    }
  }
  return bVar1 != 0;
}

Assistant:

AI_FORCE_INLINE
bool GetNextLine( const char_t*& buffer, char_t out[ BufferSize ] ) {
    if( ( char_t )'\0' == *buffer ) {
        return false;
    }

    char* _out = out;
    char* const end = _out + BufferSize;
    while( !IsLineEnd( *buffer ) && _out < end ) {
        *_out++ = *buffer++;
    }
    *_out = (char_t)'\0';

    while( IsLineEnd( *buffer ) && '\0' != *buffer ) {
        ++buffer;
    }

    return true;
}